

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sei.c
# Opt level: O2

MPP_RET process_sei(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  h264d_cur_ctx_t *phVar1;
  h264d_video_ctx_t *phVar2;
  MPP_RET MVar3;
  uint uVar4;
  RK_U32 RVar5;
  h264_sei_t *phVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  h264_sps_t *phVar11;
  char *pcVar12;
  undefined8 uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  RK_S32 _out;
  h264_sps_t *local_b0;
  h264d_video_ctx_t *local_a8;
  uint local_9c;
  BitReadCtx_t payload_bitctx;
  
  phVar1 = currSlice->p_Cur;
  phVar6 = phVar1->sei;
  if (phVar6 == (h264_sei_t *)0x0) {
    phVar6 = (h264_sei_t *)mpp_osal_calloc("process_sei",0xf8);
    currSlice->p_Cur->sei = phVar6;
  }
  bitctx = &phVar1->bitctx;
  phVar6->mvc_scalable_nesting_flag = 0;
  phVar6->p_Dec = currSlice->p_Dec;
  local_a8 = (h264d_video_ctx_t *)CONCAT44(local_a8._4_4_,0xfffffffe);
  do {
    uVar15 = 0;
    iVar16 = 0xff;
    while( true ) {
      phVar6->type = (int)uVar15;
      if (iVar16 != 0xff) break;
      uVar4 = (phVar1->bitctx).bytes_left_;
      if ((uVar4 < 2) || (0x7fffff00 < (int)uVar15)) {
        pcVar12 = "parse payload_type error: byte_left %d payload_type %d\n";
        goto LAB_0018d2fb;
      }
      MVar3 = mpp_read_bits(bitctx,8,&_out);
      (phVar1->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) goto LAB_0018d361;
      uVar15 = (ulong)(uint)(phVar6->type + _out);
      iVar16 = _out;
    }
    uVar15 = 0;
    iVar16 = 0xff;
    while( true ) {
      iVar14 = (int)uVar15;
      phVar6->payload_size = iVar14;
      uVar4 = (phVar1->bitctx).bytes_left_;
      if (iVar16 != 0xff) break;
      if ((int)uVar4 <= iVar14) {
        uVar15 = (ulong)(iVar14 + 1);
        goto LAB_0018d2ed;
      }
      MVar3 = mpp_read_bits(bitctx,8,&_out);
      (phVar1->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) goto LAB_0018d361;
      uVar15 = (ulong)(uint)(phVar6->payload_size + _out);
      iVar16 = _out;
    }
    if ((int)uVar4 < iVar14) {
LAB_0018d2ed:
      pcVar12 = "parse payload_size error: byte_left %d payload_size %d\n";
LAB_0018d2fb:
      _mpp_log_l(2,"h264d_sei",pcVar12,(char *)0x0,(ulong)uVar4,uVar15);
      return MPP_ERR_STREAM;
    }
    if ((h264d_debug._1_1_ & 0x40) != 0) {
      _mpp_log_l(4,"h264d_sei","SEI type %d, payload size: %d\n",(char *)0x0,
                 (ulong)(uint)phVar6->type);
    }
    payload_bitctx.buf_len = 0;
    payload_bitctx.ret = MPP_OK;
    payload_bitctx.prevention_type = PSEUDO_CODE_NONE;
    payload_bitctx._76_4_ = 0;
    payload_bitctx.used_bits = 0;
    payload_bitctx._52_4_ = 0;
    payload_bitctx.buf = (RK_U8 *)0x0;
    payload_bitctx.prev_two_bytes_ = 0;
    payload_bitctx.emulation_prevention_bytes_ = 0;
    payload_bitctx.update_curbyte = (_func_MPP_RET_bitread_ctx_t_ptr *)0x0;
    payload_bitctx.curr_byte_ = 0;
    payload_bitctx.num_remaining_bits_in_curr_byte_ = 0;
    payload_bitctx._28_4_ = 0;
    payload_bitctx.data_ = (RK_U8 *)0x0;
    payload_bitctx.bytes_left_ = 0;
    payload_bitctx._12_4_ = 0;
    mpp_set_bitread_ctx(&payload_bitctx,bitctx->data_,phVar6->payload_size);
    mpp_set_bitread_pseudo_code_type(&payload_bitctx,PSEUDO_CODE_H264_H265_SEI);
    switch(phVar6->type) {
    case 0:
      local_a8 = currSlice->p_Vid;
      MVar3 = mpp_read_ue(&payload_bitctx,(RK_U32 *)&_out);
      payload_bitctx.ret = MVar3;
      if (MVar3 == MPP_OK) {
        if (((uint)_out < 0x20) &&
           (phVar11 = local_a8->spsSet[(uint)_out], phVar11 != (h264_sps_t *)0x0)) {
          phVar6->seq_parameter_set_id = _out;
          local_b0 = phVar11;
          if ((phVar11->vui_seq_parameters).nal_hrd_parameters_present_flag == 0) {
LAB_0018d1e9:
            local_a8 = (h264d_video_ctx_t *)((ulong)local_a8 & 0xffffffff00000000);
            if ((local_b0->vui_seq_parameters).vcl_hrd_parameters_present_flag == 0) break;
            uVar4 = 0xffffffff;
            do {
              if ((local_b0->vui_seq_parameters).vcl_hrd_parameters.cpb_cnt_minus1 <= uVar4 + 1)
              goto LAB_0018d25c;
              local_9c = uVar4 + 1;
              MVar3 = mpp_skip_longbits(&payload_bitctx,
                                        (local_b0->vui_seq_parameters).vcl_hrd_parameters.
                                        initial_cpb_removal_delay_length_minus1);
              payload_bitctx.ret = MVar3;
              if (MVar3 != MPP_OK) break;
              MVar3 = mpp_skip_longbits(&payload_bitctx,
                                        (local_b0->vui_seq_parameters).vcl_hrd_parameters.
                                        initial_cpb_removal_delay_length_minus1);
              payload_bitctx.ret = MVar3;
              uVar4 = local_9c;
            } while (MVar3 == MPP_OK);
          }
          else {
            iVar16 = -1;
            do {
              if ((local_b0->vui_seq_parameters).nal_hrd_parameters.cpb_cnt_minus1 <= iVar16 + 1U)
              goto LAB_0018d1e9;
              local_a8 = (h264d_video_ctx_t *)CONCAT44(local_a8._4_4_,iVar16 + 1U);
              MVar3 = mpp_skip_longbits(&payload_bitctx,
                                        (local_b0->vui_seq_parameters).nal_hrd_parameters.
                                        initial_cpb_removal_delay_length_minus1);
              payload_bitctx.ret = MVar3;
              if (MVar3 != MPP_OK) break;
              MVar3 = mpp_skip_longbits(&payload_bitctx,
                                        (local_b0->vui_seq_parameters).nal_hrd_parameters.
                                        initial_cpb_removal_delay_length_minus1);
              payload_bitctx.ret = MVar3;
              iVar16 = (MPP_RET)local_a8;
            } while (MVar3 == MPP_OK);
          }
        }
        else {
          local_a8 = (h264d_video_ctx_t *)((ulong)local_a8 & 0xffffffff00000000);
          if (((byte)h264d_debug & 1) == 0) break;
          _mpp_log_l(4,"h264d_sei","seq_parameter_set_id %d may be invalid\n",(char *)0x0);
          MVar3 = payload_bitctx.ret;
        }
      }
      if (MVar3 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar3;
        }
        _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,0x122);
        return MVar3;
      }
      local_a8 = (h264d_video_ctx_t *)CONCAT44(local_a8._4_4_,MVar3);
      break;
    case 1:
      if (((ulong)phVar6->seq_parameter_set_id < 0x20) &&
         (phVar11 = currSlice->p_Vid->spsSet[phVar6->seq_parameter_set_id],
         phVar11 != (h264_sps_t *)0x0)) {
        if ((phVar11->vui_seq_parameters).nal_hrd_parameters_present_flag == 0) {
          if ((phVar11->vui_seq_parameters).vcl_hrd_parameters_present_flag != 0) {
            lVar7 = 0xff0;
            lVar9 = 0xfec;
            lVar10 = 0xfe8;
            goto LAB_0018cd71;
          }
          uVar4 = 0;
LAB_0018cdd2:
          if ((phVar11->vui_seq_parameters).pic_struct_present_flag != 0) {
            local_9c = uVar4;
            MVar3 = mpp_read_bits(&payload_bitctx,4,&_out);
            payload_bitctx.ret = MVar3;
            if ((MVar3 != MPP_OK) || ((phVar6->pic_timing).pic_struct = _out, 8 < (uint)_out))
            goto LAB_0018d335;
            bVar8 = 0x20 - (char)local_9c;
            phVar11 = (h264_sps_t *)0x0;
            iVar16 = _out;
            while (phVar11 < (h264_sps_t *)(ulong)*(uint *)(&DAT_00275cf0 + (long)iVar16 * 4)) {
              local_b0 = phVar11;
              MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
              payload_bitctx.ret = MVar3;
              if (MVar3 != MPP_OK) goto LAB_0018d335;
              (phVar6->pic_timing).clock_timestamp_flag[(long)local_b0] = _out;
              if (_out != 0) {
                MVar3 = mpp_read_bits(&payload_bitctx,2,&_out);
                phVar11 = local_b0;
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).ct_type[(long)local_b0] = _out;
                MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).nuit_field_based_flag[(long)phVar11] = _out;
                MVar3 = mpp_read_bits(&payload_bitctx,5,&_out);
                payload_bitctx.ret = MVar3;
                if ((MVar3 != MPP_OK) ||
                   ((phVar6->pic_timing).counting_type[(long)phVar11] = _out, 6 < (uint)_out))
                goto LAB_0018d335;
                MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                phVar11 = local_b0;
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).full_timestamp_flag[(long)local_b0] = _out;
                MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).discontinuity_flag[(long)phVar11] = _out;
                MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).cnt_dropped_flag[(long)phVar11] = _out;
                MVar3 = mpp_read_bits(&payload_bitctx,8,&_out);
                payload_bitctx.ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018d335;
                (phVar6->pic_timing).n_frames[(long)phVar11] = _out;
                if ((phVar6->pic_timing).full_timestamp_flag[(long)phVar11] == 0) {
                  MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                  payload_bitctx.ret = MVar3;
                  if (MVar3 != MPP_OK) goto LAB_0018d335;
                  (phVar6->pic_timing).seconds_flag[(long)local_b0] = _out;
                  if (_out != 0) {
                    MVar3 = mpp_read_bits(&payload_bitctx,6,&_out);
                    payload_bitctx.ret = MVar3;
                    if ((MVar3 != MPP_OK) ||
                       ((phVar6->pic_timing).seconds_value[(long)local_b0] = _out, 0x3b < _out))
                    goto LAB_0018d335;
                    MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                    payload_bitctx.ret = MVar3;
                    if (MVar3 != MPP_OK) goto LAB_0018d335;
                    (phVar6->pic_timing).minutes_flag[(long)local_b0] = _out;
                    if (_out != 0) {
                      MVar3 = mpp_read_bits(&payload_bitctx,6,&_out);
                      payload_bitctx.ret = MVar3;
                      if ((MVar3 != MPP_OK) ||
                         ((phVar6->pic_timing).minutes_value[(long)local_b0] = _out, 0x3b < _out))
                      goto LAB_0018d335;
                      MVar3 = mpp_read_bits(&payload_bitctx,1,&_out);
                      payload_bitctx.ret = MVar3;
                      if (MVar3 != MPP_OK) goto LAB_0018d335;
                      (phVar6->pic_timing).hours_flag[(long)local_b0] = _out;
                      if (_out != 0) goto LAB_0018d00a;
                    }
                  }
                }
                else {
                  MVar3 = mpp_read_bits(&payload_bitctx,6,&_out);
                  payload_bitctx.ret = MVar3;
                  if ((MVar3 != MPP_OK) ||
                     ((phVar6->pic_timing).seconds_value[(long)local_b0] = _out, 0x3b < _out))
                  goto LAB_0018d335;
                  MVar3 = mpp_read_bits(&payload_bitctx,6,&_out);
                  payload_bitctx.ret = MVar3;
                  if ((MVar3 != MPP_OK) ||
                     ((phVar6->pic_timing).minutes_value[(long)local_b0] = _out, 0x3b < _out))
                  goto LAB_0018d335;
LAB_0018d00a:
                  MVar3 = mpp_read_bits(&payload_bitctx,5,&_out);
                  payload_bitctx.ret = MVar3;
                  if ((MVar3 != MPP_OK) ||
                     ((phVar6->pic_timing).hours_value[(long)local_b0] = _out, 0x17 < _out))
                  goto LAB_0018d335;
                }
                if (local_9c == 0) {
                  iVar16 = 0;
                }
                else {
                  MVar3 = mpp_read_bits(&payload_bitctx,local_9c,&_out);
                  payload_bitctx.ret = MVar3;
                  if (MVar3 != MPP_OK) goto LAB_0018d335;
                  iVar16 = (_out << (bVar8 & 0x1f)) >> (bVar8 & 0x1f);
                }
                (phVar6->pic_timing).time_offset[(long)local_b0] = iVar16;
              }
              iVar16 = (phVar6->pic_timing).pic_struct;
              phVar11 = (h264_sps_t *)((long)&local_b0->Valid + 1);
            }
          }
          break;
        }
        lVar7 = 0xe50;
        lVar9 = 0xe4c;
        lVar10 = 0xe48;
LAB_0018cd71:
        local_9c = *(uint *)((long)phVar11->seq_scaling_list_present_flag + lVar7 + -0x30);
        local_b0 = (h264_sps_t *)
                   CONCAT44(local_b0._4_4_,
                            *(undefined4 *)
                             ((long)phVar11->seq_scaling_list_present_flag + lVar9 + -0x30));
        MVar3 = mpp_read_bits(&payload_bitctx,
                              *(RK_S32 *)
                               ((long)phVar11->seq_scaling_list_present_flag + lVar10 + -0x30),&_out
                             );
        payload_bitctx.ret = MVar3;
        if (MVar3 == MPP_OK) {
          (phVar6->pic_timing).cpb_removal_delay = _out;
          MVar3 = mpp_read_bits(&payload_bitctx,(RK_S32)local_b0,&_out);
          payload_bitctx.ret = MVar3;
          if (MVar3 == MPP_OK) {
            (phVar6->pic_timing).dpb_output_delay = _out;
            uVar4 = local_9c;
            goto LAB_0018cdd2;
          }
        }
      }
      else if (((byte)h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_sei","seq_parameter_set_id %d may be invalid\n",(char *)0x0);
      }
LAB_0018d335:
      if (((byte)h264d_debug & 4) == 0) goto LAB_0018d361;
      uVar13 = 0x125;
LAB_0018d35a:
      _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,uVar13);
LAB_0018d361:
      return (MPP_RET)local_a8;
    default:
      if ((h264d_debug._1_1_ & 0x40) != 0) {
        pcVar12 = "Skip parsing SEI type %d\n";
LAB_0018cd48:
        _mpp_log_l(4,"h264d_sei",pcVar12,(char *)0x0);
      }
      break;
    case 5:
      MVar3 = check_encoder_sei_info
                        (&payload_bitctx,phVar6->payload_size,&currSlice->p_Vid->deny_flag);
      if (MVar3 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) goto LAB_0018d361;
        uVar13 = 0x128;
        goto LAB_0018d35a;
      }
      if ((currSlice->p_Vid->deny_flag != 0) && ((h264d_debug._1_1_ & 0x40) != 0)) {
        _mpp_log_l(4,"h264d_sei","Bitstream is encoded by special encoder.",(char *)0x0);
      }
      break;
    case 6:
      phVar2 = currSlice->p_Vid;
      MVar3 = mpp_read_ue(&payload_bitctx,(RK_U32 *)&_out);
      payload_bitctx.ret = MVar3;
      if (MVar3 == MPP_OK) {
        if (0xffff < (uint)_out) {
          if ((h264d_debug._1_1_ & 0x40) != 0) {
            _mpp_log_l(4,"h264d_sei","recovery_frame_cnt %d, is out of range %d",(char *)0x0,
                       (ulong)(uint)_out,(ulong)(uint)phVar2->max_frame_num);
          }
LAB_0018d3f9:
          if (((byte)h264d_debug & 4) == 0) goto LAB_0018d361;
          uVar13 = 0x12e;
          goto LAB_0018d35a;
        }
        (phVar2->recovery).recovery_pic_id = 0;
        (phVar2->recovery).first_frm_id = 0;
        (phVar2->recovery).first_frm_valid = 0;
        (phVar2->recovery).valid_flag = 1;
        (phVar2->recovery).recovery_frame_cnt = _out;
        if ((h264d_debug._1_1_ & 0x40) != 0) {
          pcVar12 = "Recovery point: frame_cnt %d";
          goto LAB_0018cd48;
        }
      }
      else if (MVar3 < MPP_OK) goto LAB_0018d3f9;
    }
LAB_0018d25c:
    if ((h264d_debug._1_1_ & 0x40) != 0) {
      _mpp_log_l(4,"h264d_sei",
                 "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                 (char *)0x0,(ulong)(uint)phVar6->type,payload_bitctx._24_8_ & 0xffffffff,
                 payload_bitctx._48_8_ & 0xffffffff,payload_bitctx._8_8_ & 0xffffffff);
    }
    iVar16 = -1;
    while (iVar16 = iVar16 + 1, iVar16 < phVar6->payload_size) {
      MVar3 = mpp_skip_longbits(bitctx,8);
      (phVar1->bitctx).ret = MVar3;
      if (MVar3 != MPP_OK) goto LAB_0018d361;
    }
    RVar5 = mpp_has_more_rbsp_data(bitctx);
    if (RVar5 == 0) {
      return MPP_OK;
    }
  } while( true );
}

Assistant:

MPP_RET process_sei(H264_SLICE_t *currSlice)
{
    RK_S32  tmp_byte = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SEI_t *sei_msg  = NULL;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    BitReadCtx_t payload_bitctx;
    RK_S32 i = 0;

    if (!currSlice->p_Cur->sei)
        currSlice->p_Cur->sei = mpp_calloc(H264_SEI_t, 1);

    sei_msg = currSlice->p_Cur->sei;
    sei_msg->mvc_scalable_nesting_flag = 0;  //init to false
    sei_msg->p_Dec = currSlice->p_Dec;
    do {
        tmp_byte = 0xFF;
        sei_msg->type = 0;
        while (tmp_byte == 0xFF) {
            if (p_bitctx->bytes_left_ < 2 || sei_msg->type > INT_MAX - 255) {
                mpp_err("parse payload_type error: byte_left %d payload_type %d\n",
                        p_bitctx->bytes_left_, sei_msg->type);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->type += tmp_byte;
        }

        tmp_byte = 0xFF;
        sei_msg->payload_size = 0;
        while (tmp_byte == 0xFF) {
            if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size + 1) {
                mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                        p_bitctx->bytes_left_, sei_msg->payload_size + 1);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->payload_size += tmp_byte;
        }

        if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size) {
            mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                    p_bitctx->bytes_left_, sei_msg->payload_size);
            return MPP_ERR_STREAM;
        }

        H264D_DBG(H264D_DBG_SEI, "SEI type %d, payload size: %d\n", sei_msg->type, sei_msg->payload_size);

        memset(&payload_bitctx, 0, sizeof(payload_bitctx));
        mpp_set_bitread_ctx(&payload_bitctx, p_bitctx->data_, sei_msg->payload_size);
        mpp_set_bitread_pseudo_code_type(&payload_bitctx, PSEUDO_CODE_H264_H265_SEI);

        switch (sei_msg->type) {
        case H264_SEI_BUFFERING_PERIOD:
            FUN_CHECK(ret = interpret_buffering_period_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_PIC_TIMING:
            FUN_CHECK(interpret_picture_timing_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_USER_DATA_UNREGISTERED:
            FUN_CHECK(check_encoder_sei_info(&payload_bitctx, sei_msg->payload_size, &currSlice->p_Vid->deny_flag));

            if (currSlice->p_Vid->deny_flag)
                H264D_DBG(H264D_DBG_SEI, "Bitstream is encoded by special encoder.");
            break;
        case H264_SEI_RECOVERY_POINT:
            FUN_CHECK(interpret_recovery_point(&payload_bitctx, currSlice->p_Vid));
            break;
        default:
            H264D_DBG(H264D_DBG_SEI, "Skip parsing SEI type %d\n", sei_msg->type);
            break;
        }

        H264D_DBG(H264D_DBG_SEI, "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                  sei_msg->type, payload_bitctx.num_remaining_bits_in_curr_byte_, payload_bitctx.used_bits,
                  payload_bitctx.bytes_left_);

        for (i = 0; i < sei_msg->payload_size; i++)
            SKIP_BITS(p_bitctx, 8);
    } while (mpp_has_more_rbsp_data(p_bitctx));    // more_rbsp_data()  msg[offset] != 0x80

    return ret = MPP_OK;
__BITREAD_ERR:
__FAILED:
    return ret;
}